

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FPortalBlock,_FPortalBlock>::Resize(TArray<FPortalBlock,_FPortalBlock> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  FPortalBlock *pFVar3;
  long lVar4;
  long lVar5;
  uint amount_00;
  
  uVar2 = this->Count;
  amount_00 = amount - uVar2;
  if (amount < uVar2 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar2 - 1);
    }
  }
  else {
    Grow(this,amount_00);
    uVar2 = this->Count;
    if (uVar2 < amount) {
      lVar5 = (ulong)uVar2 * 0x18;
      lVar4 = (ulong)amount - (ulong)uVar2;
      do {
        pFVar3 = this->Array;
        puVar1 = (undefined8 *)((long)&(pFVar3->portallines).Array + lVar5);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined2 *)(&pFVar3->neighborContainsLines + lVar5) = 0;
        lVar5 = lVar5 + 0x18;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}